

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase885::run(TestCase885 *this)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  DebugExpression<bool> _kjCondition_3;
  DebugExpression<bool> _kjCondition_1;
  TestChild child2;
  TestChild child1;
  WaitScope waitScope;
  TestChild child3;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:895:3)>
  _kjDefer895;
  EventLoop loop;
  UnixEventPort port;
  sigset_t sigs;
  sigset_t oldsigs;
  DebugExpression<bool> local_351;
  DebugComparison<int,_int> local_350;
  TestChild local_330;
  TestChild local_320;
  WaitScope local_310;
  TestChild local_2f0;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:895:3)>
  local_2e0;
  char *local_2d0;
  char *pcStack_2c8;
  undefined8 local_2c0;
  char *local_2b8;
  char *pcStack_2b0;
  undefined8 local_2a8;
  EventLoop local_2a0;
  UnixEventPort local_228;
  sigset_t local_128;
  undefined1 local_a8 [128];
  
  if ((anonymous_namespace)::BROKEN_QEMU != '\0') {
    return;
  }
  captureSignals();
  do {
    iVar2 = sigemptyset(&local_128);
    if (-1 < iVar2) goto LAB_001e76e2;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_2a0.port.ptr = (EventPort *)0x0;
    local_228.super_EventPort._vptr_EventPort = (_func_int **)0x0;
    local_228.super_SleepHooks._vptr_SleepHooks = (_func_int **)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2a0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2a0);
  }
LAB_001e76e2:
  do {
    iVar2 = sigaddset(&local_128,0xf);
    if (-1 < iVar2) goto LAB_001e770c;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_2a0.port.ptr = (EventPort *)0x0;
    local_228.super_EventPort._vptr_EventPort = (_func_int **)0x0;
    local_228.super_SleepHooks._vptr_SleepHooks = (_func_int **)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2a0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2a0);
  }
LAB_001e770c:
  do {
    iVar2 = pthread_sigmask(0,&local_128,(__sigset_t *)local_a8);
    if (-1 < iVar2) goto LAB_001e773e;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_2a0.port.ptr = (EventPort *)0x0;
    local_228.super_EventPort._vptr_EventPort = (_func_int **)0x0;
    local_228.super_SleepHooks._vptr_SleepHooks = (_func_int **)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2a0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2a0);
  }
LAB_001e773e:
  local_2e0.maybeFunc.ptr.isSet = true;
  local_2e0.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:895:3)>_2
        )local_a8;
  UnixEventPort::UnixEventPort(&local_228);
  EventLoop::EventLoop(&local_2a0,&local_228.super_EventPort);
  local_310.busyPollInterval = 0xffffffff;
  local_310.fiber.ptr = (FiberBase *)0x0;
  local_310.runningStacksPool.ptr = (FiberPool *)0x0;
  local_310.loop = &local_2a0;
  EventLoop::enterScope(&local_2a0);
  TestChild::TestChild(&local_320,&local_228,0x7b);
  local_350._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  local_350.op.content.ptr = "run";
  local_350.op.content.size_ = 0x2c00000386;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  location.lineNumber = 0x386;
  location.columnNumber = 0x2c;
  bVar1 = kj::_::pollImpl((PromiseNode *)local_320.promise.super_PromiseBase.node.ptr,&local_310,
                          location);
  local_330.pid.ptr.isSet = !bVar1;
  iVar2 = extraout_EDX;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x386,ERROR,
               "\"failed: expected \" \"!child1.promise.poll(waitScope)\", _kjCondition",
               (char (*) [49])"failed: expected !child1.promise.poll(waitScope)",
               (DebugExpression<bool> *)&local_330);
    iVar2 = extraout_EDX_00;
  }
  TestChild::kill(&local_320,0xf,iVar2);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  pcStack_2b0 = "run";
  local_2a8 = 0x120000038b;
  uVar3 = Promise<int>::wait(&local_320.promise,&local_310);
  bVar1 = (uVar3 & 0x7f) == 0;
  local_350.left._0_1_ = bVar1;
  if (kj::_::Debug::minSeverity < 3 && !bVar1) {
    kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x38c,ERROR,"\"failed: expected \" \"WIFEXITED(status)\", _kjCondition",
               (char (*) [35])"failed: expected WIFEXITED(status)",
               (DebugExpression<bool> *)&local_350);
  }
  local_350.left = uVar3 >> 8 & 0xff;
  local_350.right = 0x7b;
  local_350.op.content.ptr = " == ";
  local_350.op.content.size_ = 5;
  local_350.result = local_350.left == 0x7b;
  if ((!local_350.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x38d,ERROR,"\"failed: expected \" \"WEXITSTATUS(status) == 123\", _kjCondition",
               (char (*) [44])"failed: expected WEXITSTATUS(status) == 123",&local_350);
  }
  TestChild::TestChild(&local_330,&local_228,0xea);
  TestChild::TestChild(&local_2f0,&local_228,0x159);
  local_350._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  local_350.op.content.ptr = "run";
  local_350.op.content.size_ = 0x2c00000393;
  location_00.function = "run";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  location_00.lineNumber = 0x393;
  location_00.columnNumber = 0x2c;
  bVar1 = kj::_::pollImpl((PromiseNode *)local_330.promise.super_PromiseBase.node.ptr,&local_310,
                          location_00);
  local_351.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x393,ERROR,
               "\"failed: expected \" \"!child2.promise.poll(waitScope)\", _kjCondition",
               (char (*) [49])"failed: expected !child2.promise.poll(waitScope)",&local_351);
  }
  local_350._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  local_350.op.content.ptr = "run";
  local_350.op.content.size_ = 0x2c00000394;
  location_01.function = "run";
  location_01.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  location_01.lineNumber = 0x394;
  location_01.columnNumber = 0x2c;
  bVar1 = kj::_::pollImpl((PromiseNode *)local_2f0.promise.super_PromiseBase.node.ptr,&local_310,
                          location_01);
  local_351.value = !bVar1;
  iVar2 = extraout_EDX_01;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x394,ERROR,
               "\"failed: expected \" \"!child3.promise.poll(waitScope)\", _kjCondition",
               (char (*) [49])"failed: expected !child3.promise.poll(waitScope)",&local_351);
    iVar2 = extraout_EDX_02;
  }
  TestChild::kill(&local_330,9,iVar2);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  pcStack_2c8 = "run";
  local_2c0 = 0x1200000399;
  uVar3 = Promise<int>::wait(&local_330.promise,&local_310);
  uVar3 = uVar3 & 0x7f;
  if (uVar3 == 0) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_001e7b51;
    local_350.left._0_1_ = uVar3 != 0;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x39a,ERROR,"\"failed: expected \" \"!WIFEXITED(status)\", _kjCondition",
               (char (*) [36])"failed: expected !WIFEXITED(status)",
               (DebugExpression<bool> *)&local_350);
    local_350._0_8_ = (ulong)(uint7)local_350._1_7_ << 8;
    if (2 < kj::_::Debug::minSeverity) goto LAB_001e7b51;
  }
  else {
    iVar2 = uVar3 * 0x1000000 + 0x1000000;
    local_350.left._0_1_ = SBORROW4(iVar2,0x2000000) == (int)(uVar3 * 0x1000000 + -0x1000000) < 0;
    if (2 < kj::_::Debug::minSeverity || 0x1ffffff < iVar2) goto LAB_001e7b51;
  }
  kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
             ,0x39b,ERROR,"\"failed: expected \" \"WIFSIGNALED(status)\", _kjCondition",
             (char (*) [37])"failed: expected WIFSIGNALED(status)",
             (DebugExpression<bool> *)&local_350);
LAB_001e7b51:
  local_350.right = 9;
  local_350.left = uVar3;
  local_350.op.content.ptr = " == ";
  local_350.op.content.size_ = 5;
  local_350.result = uVar3 == 9;
  if ((!local_350.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x39c,ERROR,"\"failed: expected \" \"WTERMSIG(status) == SIGKILL\", _kjCondition",
               (char (*) [45])"failed: expected WTERMSIG(status) == SIGKILL",&local_350);
  }
  local_350._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  local_350.op.content.ptr = "run";
  local_350.op.content.size_ = 0x2c0000039f;
  location_02.function = "run";
  location_02.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  location_02.lineNumber = 0x39f;
  location_02.columnNumber = 0x2c;
  bVar1 = kj::_::pollImpl((PromiseNode *)local_2f0.promise.super_PromiseBase.node.ptr,&local_310,
                          location_02);
  local_351.value = !bVar1;
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x39f,ERROR,
               "\"failed: expected \" \"!child3.promise.poll(waitScope)\", _kjCondition",
               (char (*) [49])"failed: expected !child3.promise.poll(waitScope)",&local_351);
  }
  TestChild::~TestChild(&local_2f0);
  TestChild::~TestChild(&local_330);
  TestChild::~TestChild(&local_320);
  if (local_310.fiber.ptr == (FiberBase *)0x0) {
    EventLoop::leaveScope(local_310.loop);
  }
  EventLoop::~EventLoop(&local_2a0);
  UnixEventPort::~UnixEventPort(&local_228);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:895:3)>
  ::~Deferred(&local_2e0);
  return;
}

Assistant:

TEST(Async, ArrayJoinFailFastException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  uint tasksCompleted = 0;
  auto pafs = makeCompletionCountingPafs(5, tasksCompleted);
  auto& fulfillers = pafs.fulfillers;
  Promise<void> promise = joinPromisesFailFast(kj::mv(pafs.promises));

  {
    uint i = 0;
    KJ_EXPECT(tasksCompleted == 0);

    // Joined tasks are completed eagerly, not waiting until the join node is awaited.
    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == i);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == i);

    fulfillers[i++]->reject(KJ_EXCEPTION(FAILED, "Test exception"));

    // The first rejection makes the promise ready.
    KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("Test exception", promise.wait(waitScope));
    KJ_EXPECT(tasksCompleted == i - 1);
  }
}